

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
OpenMD::FragmentStamp::getJointAtoms
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,FragmentStamp *this,int rb1,int rb2)

{
  pointer ppRVar1;
  RigidBodyStamp *this_00;
  RigidBodyStamp *this_01;
  int iVar2;
  int iVar3;
  ulong uVar4;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  pair<int,_int> pVar7;
  int index;
  int iVar8;
  pair<int,_int> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppRVar1 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_00 = ppRVar1[rb1];
  uVar4 = (ulong)((long)(this_00->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this_00->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  this_01 = ppRVar1[rb2];
  pVar7.first = 0;
  pVar7.second = 0;
  iVar8 = (int)((ulong)((long)(this_01->members_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_01->members_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  pVar5 = (pair<int,_int>)(uVar4 & 0xffffffff);
  if ((int)uVar4 < 1) {
    pVar5 = pVar7;
  }
  do {
    if (pVar7 == pVar5) {
      return __return_storage_ptr__;
    }
    iVar2 = RigidBodyStamp::getMemberAt(this_00,pVar7.first);
    pVar6 = pVar7;
    for (index = 0; iVar8 != index; index = index + 1) {
      iVar3 = RigidBodyStamp::getMemberAt(this_01,index);
      if (iVar2 == iVar3) {
        local_38 = pVar6;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,&local_38);
        break;
      }
      pVar6 = (pair<int,_int>)((long)pVar6 + 0x100000000);
    }
    pVar7 = (pair<int,_int>)((long)pVar7 + 1);
  } while( true );
}

Assistant:

bool FragmentStamp::addBendStamp(BendStamp* bend) {
    bendStamps_.push_back(bend);
    return true;
  }